

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

set_icase *
get_script_dependencies
          (set_icase *__return_storage_ptr__,string *fname,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchedScripts,set_icase *hud_files)

{
  pointer *s;
  double dVar1;
  undefined4 __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long *plVar6;
  istream *piVar7;
  long lVar8;
  undefined8 *puVar9;
  _Rb_tree_header *extraout_RAX;
  _Rb_tree_header *p_Var10;
  iterator iVar11;
  ulong uVar12;
  iterator iVar13;
  string *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  undefined8 *puVar17;
  size_type *psVar18;
  _Base_ptr p_Var19;
  pointer pcVar20;
  _Alloc_hider _Var21;
  undefined8 uVar22;
  uint __len;
  long lVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  long *local_bf0;
  ifstream myfile;
  long local_be0;
  long lStack_bd8;
  undefined1 local_9e8 [8];
  set_icase includeRes;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  string local_710;
  string local_6f0;
  string local_6d0;
  key_type local_6b0;
  key_type local_690;
  key_type local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  key_type local_4f0;
  key_type local_4d0;
  key_type local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  undefined1 local_3b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret2;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [16];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  long local_2d8;
  _Base_ptr local_2d0;
  size_type *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string folder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  size_type *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  long *local_208;
  long local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  long lStack_1f0;
  set_icase *local_1e8;
  _Rb_tree_header *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  _Base_ptr local_1c0;
  _Base_ptr local_1b8;
  undefined1 local_1b0 [16];
  _Base_ptr local_1a0;
  string trace;
  undefined1 auStack_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 local_148 [8];
  string tmpVal;
  string sprite_val;
  undefined1 local_100 [8];
  string line;
  string spr;
  string sound_val;
  string concatVal;
  string ext;
  undefined1 local_58 [8];
  string include;
  
  p_Var10 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var10->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var10->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __str_2.field_2._8_8_ = &folder._M_string_length;
  local_1e8 = hud_files;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_2.field_2 + 8),"scripts/maps/","");
  pcVar20 = (fname->_M_dataplus)._M_p;
  local_208 = (long *)&local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar20,pcVar20 + fname->_M_string_length);
  lVar8 = local_200;
  plVar6 = local_208;
  if (local_200 != 0) {
    lVar23 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar6 + lVar23));
      *(char *)((long)plVar6 + lVar23) = (char)iVar4;
      lVar23 = lVar23 + 1;
    } while (lVar8 != lVar23);
  }
  if (local_208 == (long *)&local_1f8) {
    lStack_bd8 = lStack_1f0;
    local_bf0 = &local_be0;
  }
  else {
    local_bf0 = local_208;
  }
  local_be0 = CONCAT71(uStack_1f7,local_1f8);
  _myfile = local_200;
  local_200 = 0;
  local_1f8 = 0;
  local_208 = (long *)&local_1f8;
  local_2d8 = std::__cxx11::string::find((char *)&local_bf0,0x1368bb,0);
  if (local_bf0 != &local_be0) {
    operator_delete(local_bf0);
  }
  if (local_208 != (long *)&local_1f8) {
    operator_delete(local_208);
  }
  iVar4 = std::__cxx11::string::find_last_of((char *)fname,0x136147,0xffffffffffffffff);
  if ((iVar4 != -1) && (folder._M_dataplus._M_p < (pointer)(long)iVar4)) {
    std::__cxx11::string::substr((ulong)local_9e8,(ulong)fname);
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)local_9e8,includeRes._M_t._M_impl._0_8_,0,'\x01');
    plVar16 = plVar6 + 2;
    if ((long *)*plVar6 == plVar16) {
      local_be0 = *plVar16;
      lStack_bd8 = plVar6[3];
      local_bf0 = &local_be0;
    }
    else {
      local_be0 = *plVar16;
      local_bf0 = (long *)*plVar6;
    }
    _myfile = plVar6[1];
    *plVar6 = (long)plVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)(__str_2.field_2._M_local_buf + 8),(string *)&local_bf0);
    if (local_bf0 != &local_be0) {
      operator_delete(local_bf0);
    }
    if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_9e8);
    }
  }
  contentExists(fname,true,&dummy_abi_cxx11_);
  local_1a0 = (_Base_ptr)&trace._M_string_length;
  pcVar20 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar20,pcVar20 + fname->_M_string_length);
  std::ifstream::ifstream(&local_bf0,(string *)fname,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
LAB_0012ffc2:
    std::ifstream::close();
    std::ifstream::~ifstream(&local_bf0);
    if (local_1a0 != (_Base_ptr)&trace._M_string_length) {
      operator_delete(local_1a0);
    }
    if ((size_type *)__str_2.field_2._8_8_ != &folder._M_string_length) {
      operator_delete((void *)__str_2.field_2._8_8_);
    }
    return __return_storage_ptr__;
  }
  local_100 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_2d0 = &(searchedScripts->_M_t)._M_impl.super__Rb_tree_header._M_header;
  trace.field_2._8_8_ = 0;
  sprite_val.field_2._12_4_ = 0;
  ext.field_2._8_8_ = __return_storage_ptr__;
  do {
    do {
      do {
        do {
          do {
            cVar3 = std::ios::widen((char)local_bf0[-3] + (char)(istream *)&local_bf0);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_bf0,(string *)local_100,cVar3);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
              __return_storage_ptr__ = (set_icase *)ext.field_2._8_8_;
              if (local_100 != (undefined1  [8])&line._M_string_length) {
                operator_delete((void *)local_100);
                __return_storage_ptr__ = (set_icase *)ext.field_2._8_8_;
              }
              goto LAB_0012ffc2;
            }
            parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_740;
            s = &parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)s,local_100,line._M_dataplus._M_p + (long)local_100);
            trimSpaces((string *)local_9e8,(string *)s);
            std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
            if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
              operator_delete((void *)local_9e8);
            }
            if (parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_740) {
              operator_delete(parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            lVar8 = std::__cxx11::string::find(local_100,0x1352c2,0);
            sprite_val.field_2._12_4_ = sprite_val.field_2._12_4_ + 1;
          } while (lVar8 == 0);
          lVar8 = std::__cxx11::string::find(local_100,0x1368cc,0);
          lVar23 = std::__cxx11::string::find(local_100,0x1368cf,0);
          bVar25 = lVar8 != -1;
          bVar26 = lVar23 != -1;
          if (bVar26 && bVar25) {
            do {
              std::__cxx11::string::substr((ulong)local_58,(ulong)local_100);
              std::__cxx11::string::substr((ulong)((long)&concatVal.field_2 + 8),(ulong)local_100);
              pcVar20 = (pointer)0xf;
              if (local_58 != (undefined1  [8])&include._M_string_length) {
                pcVar20 = (pointer)include._M_string_length;
              }
              if (pcVar20 < ext._M_dataplus._M_p + include._M_dataplus._M_p) {
                pcVar20 = (pointer)0xf;
                if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
                  pcVar20 = (pointer)ext._M_string_length;
                }
                if (pcVar20 < ext._M_dataplus._M_p + include._M_dataplus._M_p) goto LAB_0012df13;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)((long)&concatVal.field_2 + 8),0,(char *)0x0,
                                    (ulong)local_58);
              }
              else {
LAB_0012df13:
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append(local_58,concatVal.field_2._8_8_);
              }
              local_9e8 = (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header;
              puVar17 = puVar9 + 2;
              if ((_Rb_tree_header *)*puVar9 == (_Rb_tree_header *)puVar17) {
                includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
                includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)puVar9[3];
              }
              else {
                includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
                local_9e8 = (undefined1  [8])*puVar9;
              }
              includeRes._M_t._M_impl._0_8_ = puVar9[1];
              *puVar9 = puVar17;
              puVar9[1] = 0;
              *(undefined1 *)puVar17 = 0;
              std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
              if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
                operator_delete((void *)local_9e8);
              }
              if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
                operator_delete((void *)concatVal.field_2._8_8_);
              }
              if (local_58 != (undefined1  [8])&include._M_string_length) {
                operator_delete((void *)local_58);
              }
              lVar8 = std::__cxx11::string::find(local_100,0x1368cc,0);
              lVar23 = std::__cxx11::string::find(local_100,0x1368cf,0);
              bVar25 = lVar8 != -1;
              bVar26 = lVar23 != -1;
            } while ((bVar26) && (lVar8 != -1));
          }
          if ((trace.field_2._8_8_ & 1) == 0) {
            bVar26 = true;
            if (bVar25) {
              std::__cxx11::string::substr((ulong)local_9e8,(ulong)local_100);
              std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
              p_Var10 = &includeRes._M_t._M_impl.super__Rb_tree_header;
              if (local_9e8 != (undefined1  [8])p_Var10) {
                operator_delete((void *)local_9e8);
                p_Var10 = extraout_RAX;
              }
              bVar26 = true;
              trace.field_2._8_8_ = CONCAT71((int7)((ulong)p_Var10 >> 8),1);
            }
          }
          else if (bVar26) {
            std::__cxx11::string::substr((ulong)local_9e8,(ulong)local_100);
            std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
            if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
              operator_delete((void *)local_9e8);
            }
            bVar26 = true;
            trace.field_2._8_8_ = 0;
          }
          else {
            bVar26 = false;
          }
        } while (!bVar26);
        local_1e0 = (_Rb_tree_header *)local_1d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,local_100,line._M_dataplus._M_p + (long)local_100);
        if (local_1d8 != 0) {
          lVar8 = 0;
          do {
            if (*(char *)((long)&(local_1e0->_M_header)._M_color + lVar8) == '\t') {
              *(undefined1 *)((long)&(local_1e0->_M_header)._M_color + lVar8) = 0x20;
            }
            lVar8 = lVar8 + 1;
          } while (local_1d8 != lVar8);
        }
        p_Var10 = &includeRes._M_t._M_impl.super__Rb_tree_header;
        if (local_1e0 == (_Rb_tree_header *)local_1d0) {
          includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)local_1d0._8_8_;
          local_9e8 = (undefined1  [8])p_Var10;
        }
        else {
          local_9e8 = (undefined1  [8])local_1e0;
        }
        includeRes._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = local_1d0._1_7_;
        includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = local_1d0[0];
        includeRes._M_t._M_impl._0_8_ = local_1d8;
        local_1d8 = 0;
        local_1d0[0] = _S_red;
        local_1e0 = (_Rb_tree_header *)local_1d0;
        std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
        if (local_9e8 != (undefined1  [8])p_Var10) {
          operator_delete((void *)local_9e8);
        }
        if (local_1e0 != (_Rb_tree_header *)local_1d0) {
          operator_delete(local_1e0);
        }
        lVar8 = std::__cxx11::string::find(local_100,0x1368d2,0);
        if (lVar8 == 0) {
          readQuote((string *)(&concatVal.field_2._M_allocated_capacity + 1),(string *)local_100);
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)(&concatVal.field_2._M_allocated_capacity + 1),0,(char *)0x0,
                              __str_2.field_2._8_8_);
          local_9e8 = (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header;
          puVar17 = puVar9 + 2;
          if ((_Rb_tree_header *)*puVar9 == (_Rb_tree_header *)puVar17) {
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)puVar9[3]
            ;
          }
          else {
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
            local_9e8 = (undefined1  [8])*puVar9;
          }
          includeRes._M_t._M_impl._0_8_ = puVar9[1];
          *puVar9 = puVar17;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)local_9e8);
          folder.field_2._8_8_ = &local_258;
          psVar18 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar18) {
            local_258._M_allocated_capacity = *psVar18;
            local_258._8_8_ = plVar6[3];
          }
          else {
            local_258._M_allocated_capacity = *psVar18;
            folder.field_2._8_8_ = (size_type *)*plVar6;
          }
          *plVar6 = (long)psVar18;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          normalize_path((string *)local_58,(string *)((long)&folder.field_2 + 8),false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)folder.field_2._8_8_ != &local_258) {
            operator_delete((void *)folder.field_2._8_8_);
          }
          if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
            operator_delete((void *)local_9e8);
          }
          if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
            operator_delete((void *)concatVal.field_2._8_8_);
          }
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&searchedScripts->_M_t,(key_type *)local_58);
          if (iVar11._M_node == local_2d0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)searchedScripts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
            local_740._16_8_ = local_720;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_740 + 0x10),local_58,
                       include._M_dataplus._M_p + (long)local_58);
            push_unique((set_icase *)ext.field_2._8_8_,(string *)(local_740 + 0x10));
            if ((undefined1 *)local_740._16_8_ != local_720) {
              operator_delete((void *)local_740._16_8_);
            }
            local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_710,local_58,include._M_dataplus._M_p + (long)local_58);
            get_script_dependencies((set_icase *)local_9e8,&local_710,searchedScripts,local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_710._M_dataplus._M_p != &local_710.field_2) {
              operator_delete(local_710._M_dataplus._M_p);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
                        *)ext.field_2._8_8_,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                       (_Base_ptr)&includeRes);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_9e8);
          }
          if (local_58 != (undefined1  [8])&include._M_string_length) {
            operator_delete((void *)local_58);
          }
        }
      } while (local_2d8 != -1);
      local_9e8 = (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_9e8,local_100,line._M_dataplus._M_p + (long)local_100);
      auStack_168 = (undefined1  [8])0x0;
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while ((includeRes._M_t._M_impl._0_8_ != 0 &&
             (uVar12 = std::__cxx11::string::find((char *)local_9e8,0x135972,0),
             uVar12 < includeRes._M_t._M_impl._0_8_ - 1))) {
        std::__cxx11::string::find((char *)local_9e8,0x135972,0);
        std::__cxx11::string::substr((ulong)local_58,(ulong)local_9e8);
        std::__cxx11::string::operator=((string *)local_9e8,(string *)local_58);
        if (local_58 != (undefined1  [8])&include._M_string_length) {
          operator_delete((void *)local_58);
        }
        lVar8 = std::__cxx11::string::find((char *)local_9e8,0x135972,0);
        if (lVar8 == -1) break;
        std::__cxx11::string::find((char *)local_9e8,0x135972,0);
        std::__cxx11::string::substr((ulong)local_58,(ulong)local_9e8);
        local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6f0,local_58,include._M_dataplus._M_p + (long)local_58);
        get_ext((string *)((long)&concatVal.field_2 + 8),&local_6f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
          operator_delete(local_6f0._M_dataplus._M_p);
        }
        std::__cxx11::string::find((char *)local_9e8,0x135972,0);
        std::__cxx11::string::substr((ulong)local_148,(ulong)local_9e8);
        std::__cxx11::string::operator=((string *)local_9e8,(string *)local_148);
        if (local_148 != (undefined1  [8])&tmpVal._M_string_length) {
          operator_delete((void *)local_148);
        }
        if (include._M_dataplus._M_p != ext._M_dataplus._M_p + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_168,(value_type *)local_58);
          local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6d0,local_58,include._M_dataplus._M_p + (long)local_58);
          normalize_path((string *)local_148,&local_6d0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
            operator_delete(local_6d0._M_dataplus._M_p);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&spr.field_2 + 8),"sound/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&tmpVal.field_2 + 8),"sprites/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6b0,local_148,tmpVal._M_dataplus._M_p + (long)local_148);
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&default_content_abi_cxx11_._M_t,&local_6b0);
          bVar26 = true;
          if ((_Rb_tree_header *)iVar13._M_node ==
              &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            bVar26 = contentExists((string *)local_148,false,&dummy_abi_cxx11_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
            operator_delete(local_6b0._M_dataplus._M_p);
          }
          local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_690,spr.field_2._8_8_,
                     sound_val._M_dataplus._M_p + spr.field_2._8_8_);
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&default_content_abi_cxx11_._M_t,&local_690);
          include.field_2._M_local_buf[0xf] = '\x01';
          if ((_Rb_tree_header *)iVar13._M_node ==
              &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            include.field_2._M_local_buf[0xf] =
                 contentExists((string *)((long)&spr.field_2 + 8),false,&dummy_abi_cxx11_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_690._M_dataplus._M_p != &local_690.field_2) {
            operator_delete(local_690._M_dataplus._M_p);
          }
          local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_670,tmpVal.field_2._8_8_,
                     sprite_val._M_dataplus._M_p + tmpVal.field_2._8_8_);
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&default_content_abi_cxx11_._M_t,&local_670);
          bVar25 = true;
          if ((_Rb_tree_header *)iVar13._M_node ==
              &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            bVar25 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,&dummy_abi_cxx11_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_670._M_dataplus._M_p != &local_670.field_2) {
            operator_delete(local_670._M_dataplus._M_p);
          }
          if (((bVar26 == false && include.field_2._M_local_buf[0xf] == '\0') && bVar25 == false) &&
              0x20 < (ulong)((long)values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_168)) {
            sound_val.field_2._8_8_ = &concatVal._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&sound_val.field_2 + 8));
            if ((undefined1  [8])
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != auStack_168) {
              lVar8 = 8;
              uVar12 = 0;
              do {
                std::__cxx11::string::_M_append
                          (sound_val.field_2._M_local_buf + 8,
                           *(ulong *)((long)auStack_168 + lVar8 + -8));
                uVar12 = uVar12 + 1;
                lVar8 = lVar8 + 0x20;
              } while (uVar12 < (ulong)((long)values.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                        (long)auStack_168 >> 5));
            }
            bVar26 = contentExists((string *)((long)&sound_val.field_2 + 8),false,&dummy_abi_cxx11_)
            ;
            if (bVar26) {
              std::__cxx11::string::_M_assign((string *)local_58);
              local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_650,local_58,include._M_dataplus._M_p + (long)local_58);
              psVar14 = (string *)(line.field_2._M_local_buf + 8);
              normalize_path(psVar14,&local_650,false);
              std::__cxx11::string::operator=((string *)local_148,(string *)psVar14);
              if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p != &local_650.field_2) {
                operator_delete(local_650._M_dataplus._M_p);
              }
              std::operator+(psVar14,"sound/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_148);
              std::__cxx11::string::operator=
                        ((string *)(spr.field_2._M_local_buf + 8),(string *)psVar14);
              if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
              local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4f0,local_148,tmpVal._M_dataplus._M_p + (long)local_148);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_4f0);
              if ((_Rb_tree_header *)iVar13._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                contentExists((string *)local_148,false,&dummy_abi_cxx11_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                operator_delete(local_4f0._M_dataplus._M_p);
              }
              local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4d0,spr.field_2._8_8_,
                         sound_val._M_dataplus._M_p + spr.field_2._8_8_);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_4d0);
              include.field_2._M_local_buf[0xf] = '\x01';
              if ((_Rb_tree_header *)iVar13._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                include.field_2._M_local_buf[0xf] =
                     contentExists((string *)((long)&spr.field_2 + 8),false,&dummy_abi_cxx11_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                operator_delete(local_4d0._M_dataplus._M_p);
              }
              local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4b0,tmpVal.field_2._8_8_,
                         sprite_val._M_dataplus._M_p + tmpVal.field_2._8_8_);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_4b0);
              bVar25 = true;
              if ((_Rb_tree_header *)iVar13._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                bVar25 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,&dummy_abi_cxx11_
                                      );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                operator_delete(local_4b0._M_dataplus._M_p);
              }
            }
            if ((size_type *)sound_val.field_2._8_8_ != &concatVal._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
          }
          iVar4 = std::__cxx11::string::compare(concatVal.field_2._M_local_buf + 8);
          if (iVar4 == 0) {
            local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_490,local_58,include._M_dataplus._M_p + (long)local_58);
            normalize_path(&local_7a0,&local_490,false);
            local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_630,local_1a0,trace._M_dataplus._M_p + (long)local_1a0);
            add_model_resources(&local_7a0,(set_icase *)ext.field_2._8_8_,&local_630);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_630._M_dataplus._M_p != &local_630.field_2) {
              operator_delete(local_630._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
              operator_delete(local_7a0._M_dataplus._M_p);
            }
            paVar15 = &local_490.field_2;
            uVar22 = local_490._M_dataplus._M_p;
          }
          else {
            iVar4 = std::__cxx11::string::compare(concatVal.field_2._M_local_buf + 8);
            if (iVar4 == 0) {
              sound_val.field_2._8_8_ = &concatVal._M_string_length;
              plVar6 = (long *)local_58;
              if (bVar25 != false) {
                plVar6 = (long *)((long)&tmpVal.field_2 + 8);
              }
              psVar14 = &include;
              if (bVar25 != false) {
                psVar14 = &sprite_val;
              }
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((long)&sound_val.field_2 + 8),*plVar6,
                         (psVar14->_M_dataplus)._M_p + *plVar6);
              local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_610,sound_val.field_2._8_8_,
                         concatVal._M_dataplus._M_p + sound_val.field_2._8_8_);
              normalize_path((string *)(line.field_2._M_local_buf + 8),&local_610,false);
              std::__cxx11::string::operator=
                        ((string *)local_58,(string *)(line.field_2._M_local_buf + 8));
              if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_610._M_dataplus._M_p != &local_610.field_2) {
                operator_delete(local_610._M_dataplus._M_p);
              }
              local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_470,local_58,include._M_dataplus._M_p + (long)local_58);
              local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5f0,local_1a0,trace._M_dataplus._M_p + (long)local_1a0);
              trace_missing_file(&local_470,&local_5f0,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                operator_delete(local_5f0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_470._M_dataplus._M_p != &local_470.field_2) {
                operator_delete(local_470._M_dataplus._M_p);
              }
              local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_450,local_58,include._M_dataplus._M_p + (long)local_58);
              push_unique((set_icase *)ext.field_2._8_8_,&local_450);
              psVar14 = &local_450;
              _Var21._M_p = local_450._M_dataplus._M_p;
LAB_0012ef1f:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var21._M_p != &psVar14->field_2) {
                operator_delete(_Var21._M_p);
              }
            }
            else {
              sound_val.field_2._8_8_ = &concatVal._M_string_length;
              plVar6 = (long *)local_58;
              if (include.field_2._M_local_buf[0xf] != '\0') {
                plVar6 = (long *)((long)&spr.field_2 + 8);
              }
              psVar14 = &include;
              if (include.field_2._M_local_buf[0xf] != '\0') {
                psVar14 = &sound_val;
              }
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((long)&sound_val.field_2 + 8),*plVar6,
                         (psVar14->_M_dataplus)._M_p + *plVar6);
              local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5d0,sound_val.field_2._8_8_,
                         concatVal._M_dataplus._M_p + sound_val.field_2._8_8_);
              normalize_path((string *)(line.field_2._M_local_buf + 8),&local_5d0,false);
              std::__cxx11::string::operator=
                        ((string *)local_58,(string *)(line.field_2._M_local_buf + 8));
              if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                operator_delete(local_5d0._M_dataplus._M_p);
              }
              lVar8 = 0;
              do {
                iVar4 = std::__cxx11::string::compare(concatVal.field_2._M_local_buf + 8);
                if (iVar4 == 0) {
                  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_430,local_58,include._M_dataplus._M_p + (long)local_58
                            );
                  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5b0,local_1a0,trace._M_dataplus._M_p + (long)local_1a0
                            );
                  trace_missing_file(&local_430,&local_5b0,true);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
                    operator_delete(local_5b0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._M_dataplus._M_p != &local_430.field_2) {
                    operator_delete(local_430._M_dataplus._M_p);
                  }
                  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_410,local_58,include._M_dataplus._M_p + (long)local_58
                            );
                  push_unique((set_icase *)ext.field_2._8_8_,&local_410);
                  psVar14 = &local_410;
                  _Var21._M_p = local_410._M_dataplus._M_p;
                  goto LAB_0012ef1f;
                }
                lVar8 = lVar8 + 4;
              } while (lVar8 != 0x58);
            }
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&concatVal._M_string_length;
            uVar22 = sound_val.field_2._8_8_;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar22 != paVar15) {
            operator_delete((void *)uVar22);
          }
          if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
            operator_delete((void *)tmpVal.field_2._8_8_);
          }
          if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
            operator_delete((void *)spr.field_2._8_8_);
          }
          if (local_148 != (undefined1  [8])&tmpVal._M_string_length) {
            operator_delete((void *)local_148);
          }
        }
        if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
          operator_delete((void *)concatVal.field_2._8_8_);
        }
        if (local_58 != (undefined1  [8])&include._M_string_length) {
          operator_delete((void *)local_58);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_168);
      if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_9e8);
      }
      lVar8 = std::__cxx11::string::find(local_100,0x1368db,0);
    } while (lVar8 == -1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "ERROR: Failed to parse custom weapon definition in ",fname);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_148);
    concatVal.field_2._8_8_ = &ext._M_string_length;
    psVar18 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar18) {
      ext._M_string_length = *psVar18;
      ext.field_2._M_allocated_capacity = plVar6[3];
    }
    else {
      ext._M_string_length = *psVar18;
      concatVal.field_2._8_8_ = (size_type *)*plVar6;
    }
    ext._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar18;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __val = -sprite_val.field_2._12_4_;
    if (0 < (int)sprite_val.field_2._12_4_) {
      __val = sprite_val.field_2._12_4_;
    }
    __len = 1;
    if (9 < (uint)__val) {
      uVar12 = (ulong)(uint)__val;
      uVar24 = 4;
      do {
        __len = uVar24;
        uVar5 = (uint)uVar12;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0012f0ca;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0012f0ca;
        }
        if (uVar5 < 10000) goto LAB_0012f0ca;
        uVar12 = uVar12 / 10000;
        uVar24 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0012f0ca:
    uVar24 = (uint)sprite_val.field_2._12_4_ >> 0x1f;
    spr.field_2._8_8_ = &sound_val._M_string_length;
    std::__cxx11::string::_M_construct
              ((ulong)((long)&spr.field_2 + 8),
               (char)__len - (char)((int)sprite_val.field_2._12_4_ >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)uVar24 + spr.field_2._8_8_),__len,__val);
    pcVar20 = (pointer)0xf;
    if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
      pcVar20 = (pointer)ext._M_string_length;
    }
    if (pcVar20 < sound_val._M_dataplus._M_p + ext._M_dataplus._M_p) {
      pcVar20 = (pointer)0xf;
      if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
        pcVar20 = (pointer)sound_val._M_string_length;
      }
      if (pcVar20 < sound_val._M_dataplus._M_p + ext._M_dataplus._M_p) goto LAB_0012f15e;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)((long)&spr.field_2 + 8),0,(char *)0x0,concatVal.field_2._8_8_);
    }
    else {
LAB_0012f15e:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append(concatVal.field_2._M_local_buf + 8,spr.field_2._8_8_)
      ;
    }
    local_9e8 = (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header;
    puVar17 = puVar9 + 2;
    if ((_Rb_tree_header *)*puVar9 == (_Rb_tree_header *)puVar17) {
      includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
      includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)puVar9[3];
    }
    else {
      includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar17;
      local_9e8 = (undefined1  [8])*puVar9;
    }
    includeRes._M_t._M_impl._0_8_ = puVar9[1];
    *puVar9 = puVar17;
    puVar9[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)local_9e8);
    psVar18 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar18) {
      include._M_string_length = *psVar18;
      include.field_2._M_allocated_capacity = plVar6[3];
      local_58 = (undefined1  [8])&include._M_string_length;
    }
    else {
      include._M_string_length = *psVar18;
      local_58 = (undefined1  [8])*plVar6;
    }
    include._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar18;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_9e8);
    }
    if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
      operator_delete((void *)spr.field_2._8_8_);
    }
    if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
      operator_delete((void *)concatVal.field_2._8_8_);
    }
    if (local_148 != (undefined1  [8])&tmpVal._M_string_length) {
      operator_delete((void *)local_148);
    }
    std::__cxx11::string::find((char *)local_100,0x1368db,0);
    concatVal.field_2._8_8_ = &ext._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&concatVal.field_2 + 8),"g_ItemRegistry.RegisterWeapon(","");
    std::__cxx11::string::substr((ulong)local_9e8,(ulong)local_100);
    std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
    if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_9e8);
    }
    if ((size_type *)concatVal.field_2._8_8_ != &ext._M_string_length) {
      operator_delete((void *)concatVal.field_2._8_8_);
    }
    iVar4 = std::__cxx11::string::find_first_of((char *)local_100,0x136700,0);
    if ((pointer)(long)iVar4 < line._M_dataplus._M_p + -1) {
      std::__cxx11::string::substr((ulong)&local_7e0,(ulong)local_100);
      trimSpaces((string *)((long)&concatVal.field_2 + 8),&local_7e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
        operator_delete(local_7e0._M_dataplus._M_p);
      }
      std::__cxx11::string::substr((ulong)local_9e8,(ulong)local_100);
      std::__cxx11::string::operator=((string *)local_100,(string *)local_9e8);
      if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_9e8);
      }
      iVar4 = std::__cxx11::string::find_first_of(local_100,0x136700,0);
      if (iVar4 == -1) {
        iVar4 = std::__cxx11::string::find_last_of(local_100,0x135e16,0xffffffffffffffff);
      }
      if ((pointer)(long)iVar4 < line._M_dataplus._M_p + -1) {
        std::__cxx11::string::substr((ulong)&local_7c0,(ulong)local_100);
        trimSpaces((string *)local_148,&local_7c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
          operator_delete(local_7c0._M_dataplus._M_p);
        }
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,concatVal.field_2._8_8_,
                   ext._M_dataplus._M_p + concatVal.field_2._8_8_);
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        pcVar20 = (fname->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,pcVar20,pcVar20 + fname->_M_string_length);
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_590,local_58,include._M_dataplus._M_p + (long)local_58);
        parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_780,&local_3f0,&local_3d0,&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p);
        }
        ret2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &ret2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148,
                   tmpVal._M_dataplus._M_p + (long)local_148);
        local_378._M_allocated_capacity = (size_type)local_368;
        pcVar20 = (fname->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)local_388 + 0x10),pcVar20,pcVar20 + fname->_M_string_length);
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_570,local_58,include._M_dataplus._M_p + (long)local_58);
        parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3b0,
                         (string *)
                         &ret2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (string *)((long)local_388 + 0x10),&local_570);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._M_allocated_capacity != local_368) {
          operator_delete((void *)local_378._M_allocated_capacity);
        }
        if (ret2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388) {
          operator_delete(ret2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (((undefined1  [8])
             ret1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_780) &&
           ((undefined1  [8])
            ret2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != local_3b0)) {
          if (((ulong)((long)ret1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_780) < 0x21) &&
             ((ulong)((long)ret2.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)local_3b0) < 0x21)) {
            std::__cxx11::string::_M_assign((string *)(concatVal.field_2._M_local_buf + 8));
            std::__cxx11::string::_M_assign((string *)local_148);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sound_val.field_2._M_local_buf + 8),"sprites/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
            plVar6 = (long *)std::__cxx11::string::append(sound_val.field_2._M_local_buf + 8);
            tmpVal.field_2._8_8_ = &sprite_val._M_string_length;
            psVar18 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar18) {
              sprite_val._M_string_length = *psVar18;
              sprite_val.field_2._M_allocated_capacity = plVar6[3];
            }
            else {
              sprite_val._M_string_length = *psVar18;
              tmpVal.field_2._8_8_ = (size_type *)*plVar6;
            }
            sprite_val._M_dataplus._M_p = (pointer)plVar6[1];
            *plVar6 = (long)psVar18;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::operator+((string *)local_9e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&tmpVal.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&concatVal.field_2 + 8));
            plVar6 = (long *)std::__cxx11::string::append((char *)local_9e8);
            spr.field_2._8_8_ = &sound_val._M_string_length;
            psVar18 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar18) {
              sound_val._M_string_length = *psVar18;
              sound_val.field_2._M_allocated_capacity = plVar6[3];
            }
            else {
              sound_val._M_string_length = *psVar18;
              spr.field_2._8_8_ = (size_type *)*plVar6;
            }
            sound_val._M_dataplus._M_p = (pointer)plVar6[1];
            *plVar6 = (long)psVar18;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (local_9e8 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
              operator_delete((void *)local_9e8);
            }
            if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
              operator_delete((void *)tmpVal.field_2._8_8_);
            }
            if ((size_type *)sound_val.field_2._8_8_ != &concatVal._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,spr.field_2._8_8_,
                       sound_val._M_dataplus._M_p + spr.field_2._8_8_);
            local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_550,local_1a0,trace._M_dataplus._M_p + (long)local_1a0);
            trace_missing_file(&local_358,&local_550,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._M_dataplus._M_p != &local_550.field_2) {
              operator_delete(local_550._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p);
            }
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_338,spr.field_2._8_8_,
                       sound_val._M_dataplus._M_p + spr.field_2._8_8_);
            push_unique(local_1e8,&local_338);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p);
            }
            tmpVal.field_2._8_8_ = &sprite_val._M_string_length;
            psVar14 = (string *)((long)&tmpVal.field_2 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar14,spr.field_2._8_8_,
                       sound_val._M_dataplus._M_p + spr.field_2._8_8_);
            bVar26 = contentExists(psVar14,true,&dummy_abi_cxx11_);
            if (bVar26) {
              std::ifstream::ifstream
                        ((string *)local_9e8,(string *)(tmpVal.field_2._M_local_buf + 8),_S_in);
              cVar3 = std::__basic_file<char>::is_open();
              if (cVar3 != '\0') {
                sound_val.field_2._8_8_ = &concatVal._M_string_length;
                concatVal._M_dataplus._M_p = (pointer)0x0;
                concatVal._M_string_length._0_1_ = 0;
                while( true ) {
                  cVar3 = std::ios::widen((char)*(undefined8 *)((long)local_9e8 + -0x18) +
                                          (char)(string *)local_9e8);
                  piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)local_9e8,
                                      (string *)(sound_val.field_2._M_local_buf + 8),cVar3);
                  if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
                  lVar8 = std::__cxx11::string::find(sound_val.field_2._M_local_buf + 8,0x1352c2,0);
                  if (lVar8 != -1) {
                    std::__cxx11::string::substr
                              ((ulong)(line.field_2._M_local_buf + 8),
                               (ulong)(sound_val.field_2._M_local_buf + 8));
                    std::__cxx11::string::operator=
                              ((string *)(sound_val.field_2._M_local_buf + 8),
                               (string *)(line.field_2._M_local_buf + 8));
                    if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                      operator_delete((void *)line.field_2._8_8_);
                    }
                  }
                  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_530,sound_val.field_2._8_8_,
                             concatVal._M_dataplus._M_p + sound_val.field_2._8_8_);
                  trimSpaces((string *)(line.field_2._M_local_buf + 8),&local_530);
                  std::__cxx11::string::operator=
                            ((string *)(sound_val.field_2._M_local_buf + 8),
                             (string *)(line.field_2._M_local_buf + 8));
                  if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                    operator_delete((void *)line.field_2._8_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_530._M_dataplus._M_p != &local_530.field_2) {
                    operator_delete(local_530._M_dataplus._M_p);
                  }
                  local_1c0 = (_Base_ptr)local_1b0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1c0,sound_val.field_2._8_8_,
                             concatVal._M_dataplus._M_p + sound_val.field_2._8_8_);
                  if (local_1b8 != (_Base_ptr)0x0) {
                    p_Var19 = (_Base_ptr)0x0;
                    do {
                      if (*(char *)((long)&p_Var19->_M_color + (long)&local_1c0->_M_color) == '\t')
                      {
                        *(char *)((long)&p_Var19->_M_color + (long)&local_1c0->_M_color) = ' ';
                      }
                      p_Var19 = (_Base_ptr)((long)&p_Var19->_M_color + 1);
                    } while (local_1b8 != p_Var19);
                  }
                  if (local_1c0 == (_Base_ptr)local_1b0) {
                    spr.field_2._M_allocated_capacity = local_1b0._8_8_;
                    line.field_2._8_8_ = &spr._M_string_length;
                  }
                  else {
                    line.field_2._8_8_ = local_1c0;
                  }
                  spr._M_string_length = CONCAT71(local_1b0._1_7_,local_1b0[0]);
                  spr._M_dataplus._M_p = (pointer)local_1b8;
                  local_1b8 = (_Base_ptr)0x0;
                  local_1b0[0] = _S_red;
                  local_1c0 = (_Base_ptr)local_1b0;
                  std::__cxx11::string::operator=
                            ((string *)(sound_val.field_2._M_local_buf + 8),
                             (string *)(line.field_2._M_local_buf + 8));
                  if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                    operator_delete((void *)line.field_2._8_8_);
                  }
                  if (local_1c0 != (_Base_ptr)local_1b0) {
                    operator_delete(local_1c0);
                  }
                  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_510,sound_val.field_2._8_8_,
                             concatVal._M_dataplus._M_p + sound_val.field_2._8_8_);
                  splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&ret1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_510," ")
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p != &local_510.field_2) {
                    operator_delete(local_510._M_dataplus._M_p);
                  }
                  if (0x40 < (ulong)((long)parts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                    (long)ret1.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)auStack_168,"sprites/",
                                   ret1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
                    plVar6 = (long *)std::__cxx11::string::append((char *)auStack_168);
                    line.field_2._8_8_ = &spr._M_string_length;
                    psVar18 = (size_type *)(plVar6 + 2);
                    if ((size_type *)*plVar6 == psVar18) {
                      spr._M_string_length = *psVar18;
                      spr.field_2._M_allocated_capacity = plVar6[3];
                    }
                    else {
                      spr._M_string_length = *psVar18;
                      line.field_2._8_8_ = (size_type *)*plVar6;
                    }
                    spr._M_dataplus._M_p = (pointer)plVar6[1];
                    *plVar6 = (long)psVar18;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    if (auStack_168 !=
                        (undefined1  [8])
                        &values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
                      operator_delete((void *)auStack_168);
                    }
                    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_318,line.field_2._8_8_,
                               spr._M_dataplus._M_p + line.field_2._8_8_);
                    auStack_168 = (undefined1  [8])
                                  &values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)auStack_168,local_1a0,
                               trace._M_dataplus._M_p + (long)local_1a0);
                    std::__cxx11::string::append((char *)auStack_168);
                    plVar6 = (long *)std::__cxx11::string::_M_append
                                               ((char *)auStack_168,spr.field_2._8_8_);
                    __str_3.field_2._8_8_ = &local_218;
                    psVar18 = (size_type *)(plVar6 + 2);
                    if ((size_type *)*plVar6 == psVar18) {
                      local_218._M_allocated_capacity = *psVar18;
                      local_218._8_8_ = plVar6[3];
                    }
                    else {
                      local_218._M_allocated_capacity = *psVar18;
                      __str_3.field_2._8_8_ = (size_type *)*plVar6;
                    }
                    *plVar6 = (long)psVar18;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    trace_missing_file(&local_318,(string *)((long)&__str_3.field_2 + 8),true);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str_3.field_2._8_8_ != &local_218) {
                      operator_delete((void *)__str_3.field_2._8_8_);
                    }
                    if (auStack_168 !=
                        (undefined1  [8])
                        &values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
                      operator_delete((void *)auStack_168);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_318._M_dataplus._M_p != &local_318.field_2) {
                      operator_delete(local_318._M_dataplus._M_p);
                    }
                    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2f8,line.field_2._8_8_,
                               spr._M_dataplus._M_p + line.field_2._8_8_);
                    push_unique((set_icase *)ext.field_2._8_8_,&local_2f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                      operator_delete(local_2f8._M_dataplus._M_p);
                    }
                    if ((size_type *)line.field_2._8_8_ != &spr._M_string_length) {
                      operator_delete((void *)line.field_2._8_8_);
                    }
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&ret1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if ((size_type *)sound_val.field_2._8_8_ != &concatVal._M_string_length) {
                  operator_delete((void *)sound_val.field_2._8_8_);
                }
              }
              std::ifstream::close();
              std::ifstream::~ifstream((string *)local_9e8);
            }
            if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
              operator_delete((void *)tmpVal.field_2._8_8_);
            }
            pbVar2 = &sound_val;
            uVar22 = spr.field_2._8_8_;
          }
          else {
            local_248 = &__str_3._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,local_58,include._M_dataplus._M_p + (long)local_58);
            dVar1 = (double)std::__cxx11::string::append((char *)&local_248);
            log(dVar1);
            pbVar2 = &__str_3;
            uVar22 = local_248;
          }
          if ((size_type *)uVar22 != &pbVar2->_M_string_length) {
            operator_delete((void *)uVar22);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_780);
        pbVar2 = &tmpVal;
        uVar22 = local_148;
      }
      else {
        __str_1.field_2._8_8_ = &__str_2._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(__str_1.field_2._M_local_buf + 8),local_58,
                   include._M_dataplus._M_p + (long)local_58);
        dVar1 = (double)std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
        log(dVar1);
        pbVar2 = &__str_2;
        uVar22 = __str_1.field_2._8_8_;
      }
      if ((size_type *)uVar22 != &pbVar2->_M_string_length) {
        operator_delete((void *)uVar22);
      }
      pbVar2 = &ext;
      uVar22 = concatVal.field_2._8_8_;
    }
    else {
      local_2c8 = &__str_1._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_58,include._M_dataplus._M_p + (long)local_58);
      dVar1 = (double)std::__cxx11::string::append((char *)&local_2c8);
      log(dVar1);
      pbVar2 = &__str_1;
      uVar22 = local_2c8;
    }
    if ((size_type *)uVar22 != &pbVar2->_M_string_length) {
      operator_delete((void *)uVar22);
    }
    if (local_58 != (undefined1  [8])&include._M_string_length) {
      operator_delete((void *)local_58);
    }
  } while( true );
}

Assistant:

set_icase get_script_dependencies(string fname, set<string>& searchedScripts, set_icase& hud_files)
{
	set_icase resources;

	string folder = "scripts/maps/";

	// ignore sounds/models in this script. They're false positives.
	bool isWeaponCustom = toLowerCase(fname).find("weapon_custom.as") != string::npos;

	int idir = fname.find_last_of("/\\");
	if (idir != string::npos && idir > folder.length())
		folder = fname.substr(0, idir) + '/';

	contentExists(fname, true); // fix caps

	string trace = fname;

	ifstream myfile(fname);
	if (myfile.is_open())
	{
		int lineNum = 0;
		bool inCommentBlock = false;
		string line;
		while (getline(myfile, line))
		{
			lineNum++;

			line = trimSpaces(line);
			if (line.find("//") == 0)
				continue;
			
			// check for block comments
			{	
				size_t commentStart = line.find("/*");
				size_t commentEnd = line.find("*/");

				// remove inline block comments
				while (commentStart != string::npos && commentEnd != string::npos)
				{
					line = line.substr(0, commentStart) + line.substr(commentEnd+2);
					commentStart = line.find("/*");
					commentEnd = line.find("*/");
				}

				// ignore lines contained in comment blocks
				if (inCommentBlock)
				{
					if (commentEnd != string::npos)
					{
						inCommentBlock = false;
						line = line.substr(commentEnd+2);
						commentStart = commentEnd = string::npos;
					}
					else
						continue;
				}				
				else if (commentStart != string::npos)
				{
					line = line.substr(0, commentStart);
					inCommentBlock = true;
				}
			}

			line = replaceChar(line, '\t', ' ' );
			
			if (line.find("#include") == 0) 
			{
				// .as extension is optional in cfg file, but required to be ommitted in #include statements
				string include = normalize_path(folder + readQuote(line) + ".as");
				if (searchedScripts.find(include) == searchedScripts.end())
				{
					searchedScripts.insert(include);
					push_unique(resources, include);
					set_icase includeRes = get_script_dependencies(include, searchedScripts, hud_files);
					resources.insert(includeRes.begin(), includeRes.end());
				}
			}

			// look for string literals
			if (!isWeaponCustom) {
				string s = line;
				vector<string> values;
				while (s.length())
				{
					if (s.find("\"") >= s.length() - 1)
						break;
					s = s.substr(s.find("\"") + 1);

					if (s.find("\"") == string::npos)
						break;

					string val = s.substr(0, s.find("\""));
					string ext = get_ext(val);

					s = s.substr(s.find("\"")+1);	

					if (val.length() == ext.length() + 1)
						continue; // probably a path constructed from vars

					values.push_back(val);

					// handle case where the full path is broken up into separate string literals for no reason
					string tmpVal = normalize_path(val);
					string sound_val = "sound/" + tmpVal;
					string sprite_val = "sprites/" + tmpVal;
					bool valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
					bool soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
					bool spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
					if (values.size() > 1 && !valExists && !soundValExists && !spriteValExists)
					{
						string concatVal = "";
						for (int i = 0; i < values.size(); i++)
							concatVal += values[i];
						if (contentExists(concatVal, false))
						{
							val = concatVal;
							
							tmpVal = normalize_path(val);
							sound_val = "sound/" + tmpVal;
							valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
							soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
							spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
						}
					}

					if (ext == "mdl")
					{
						add_model_resources(normalize_path(val), resources, trace);
					}
					else if (ext == "spr")
					{
						// sprites/ prefix is optional for HUD parameters
						string valpath = spriteValExists ? sprite_val : val;

						val = normalize_path(valpath);
						trace_missing_file(val, trace, true);
						push_unique(resources, val);
					}
					else
					{
						// probably safe to assume the script is using sounds correctly,
						// so it's ok if the prefix is missing. Just try to find a plausible match.
						// There will be too many false positives otherwise.
						string valpath = soundValExists ? sound_val : val;
						
						val = normalize_path(valpath);
						for (int k = 0; k < NUM_SOUND_EXTS; k++)
						{
							if (ext == g_valid_exts[k])
							{
								trace_missing_file(val, trace, true);
								push_unique(resources, val);
								break;
							}
						}
					}
				}
				
			}

			// try to parse out custom weapon sprite files
			if (!isWeaponCustom && line.find("g_ItemRegistry.RegisterWeapon(") != string::npos)
			{
				string err = "ERROR: Failed to parse custom weapon definition in " + fname + " (line " + to_string(lineNum) + ")\n";
				line = line.substr(line.find("g_ItemRegistry.RegisterWeapon(") + string("g_ItemRegistry.RegisterWeapon(").length());
				int comma = line.find_first_of(",");
				if (comma >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg1 = trimSpaces(line.substr(0, comma));

				line = line.substr(comma+1);
				int comma2 = line.find_first_of(",");
				if (comma2 == string::npos)
					comma2 = line.find_last_of(")"); // third arg is optional
				if (comma2 >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg2 = trimSpaces(line.substr(0, comma2));

				vector<string> ret1 = parse_script_arg(arg1, fname, err);
				vector<string> ret2 = parse_script_arg(arg2, fname, err);

				if (ret1.size() == 0 || ret2.size() == 0)
					continue;

				if (ret1.size() > 1 || ret2.size() > 1)
				{
					log(err + "\t Reason: array argument(s) with variable index not handled\n");
					continue;
				}

				arg1 = ret1[0];
				arg2 = ret2[0];

				// Note: code duplicated in Bsp.cpp (weapon_custom)
				string hud_file = "sprites/" + arg2 + "/" + arg1 + ".txt";
				trace_missing_file(hud_file, trace, true);
				push_unique(hud_files, hud_file);

				string hud_path = hud_file;
				if (contentExists(hud_path, true))
				{
					ifstream file(hud_path);
					if (file.is_open())
					{
						int lineNum = 0;
						bool in_func_body = false;
						string line;
						while (getline(file, line))
						{
							lineNum++;

							// strip comments
							size_t cpos = line.find("//");
							if (cpos != string::npos)
								line = line.substr(0, cpos);

							line = trimSpaces(line);

							line = replaceChar(line, '\t', ' ');
							vector<string> parts = splitString(line, " ");

							if (parts.size() < 3)
								continue;
							
							string spr = "sprites/" + parts[2] + ".spr";
							trace_missing_file(spr, trace + " --> " + hud_file, true);
							push_unique(resources, spr);
						}
					}
					file.close();
				}
			}
		}
	}
	//else
	//	cout << "Failed to open: " << fname << endl; // not needed - file will be flagged as missing later
	myfile.close();

	return resources;
}